

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintMiterStatus(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_34;
  uint local_30;
  int iOut;
  int nUndec;
  int nUnsat;
  int nSat;
  int i;
  Gia_Obj_t *pChild;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  nUndec = 0;
  iOut = 0;
  local_30 = 0;
  local_34 = -1;
  nUnsat = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (nUnsat < iVar1) {
      pChild = Gia_ManCo(p,nUnsat);
      bVar5 = pChild != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pGVar3 = Gia_ObjChild0(pChild);
    pGVar4 = Gia_ManConst0(p);
    if (pGVar3 == pGVar4) {
      iOut = iOut + 1;
    }
    else {
      pGVar4 = Gia_ManConst1(p);
      if (pGVar3 == pGVar4) {
        nUndec = nUndec + 1;
        if (local_34 == -1) {
          local_34 = nUnsat;
        }
      }
      else {
        pGVar3 = Gia_Regular(pGVar3);
        iVar1 = Gia_ObjIsPi(p,pGVar3);
        if (iVar1 == 0) {
          local_30 = local_30 + 1;
        }
        else {
          nUndec = nUndec + 1;
          if (local_34 == -1) {
            local_34 = nUnsat;
          }
        }
      }
    }
    nUnsat = nUnsat + 1;
  }
  uVar2 = Gia_ManPoNum(p);
  Abc_Print(1,"Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",(ulong)uVar2,
            (ulong)(uint)iOut,(ulong)(uint)nUndec,(ulong)local_30);
  return;
}

Assistant:

void Gia_ManPrintMiterStatus( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pChild;
    int i, nSat = 0, nUnsat = 0, nUndec = 0, iOut = -1;
    Gia_ManForEachPo( p, pObj, i )
    {
        pChild = Gia_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Gia_ManConst0(p) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Gia_ManConst1(p) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Gia_ObjIsPi(p, Gia_Regular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
/*
        // check if the output is 1 for the 0000 pattern
        else if ( Gia_Regular(pChild)->fPhase != (unsigned)Gia_IsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
*/
        else
            nUndec++;
    }
    Abc_Print( 1, "Outputs = %7d.  Unsat = %7d.  Sat = %7d.  Undec = %7d.\n",
        Gia_ManPoNum(p), nUnsat, nSat, nUndec );
}